

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_nodesel.cc
# Opt level: O1

void __thiscall QL_NodeSel::QL_NodeSel(QL_NodeSel *this,QL_Manager *qlm,QL_Node *prevNode)

{
  QL_Node::QL_Node(&this->super_QL_Node,qlm);
  (this->super_QL_Node)._vptr_QL_Node = (_func_int **)&PTR_OpenIt_00127af8;
  this->prevNode = prevNode;
  (this->super_QL_Node).isOpen = false;
  (this->super_QL_Node).listsInitialized = false;
  (this->super_QL_Node).tupleLength = 0;
  (this->super_QL_Node).attrsInRecSize = 0;
  (this->super_QL_Node).condIndex = 0;
  return;
}

Assistant:

QL_NodeSel::QL_NodeSel(QL_Manager &qlm, QL_Node &prevNode) : QL_Node(qlm), prevNode(prevNode) {
  isOpen = false;
  listsInitialized = false;
  tupleLength = 0;
  attrsInRecSize = 0;
  condIndex = 0;
  attrsInRecSize = 0;
}